

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O3

parse_buffer * buffer_skip_whitespace(parse_buffer *buffer)

{
  parse_buffer *ppVar1;
  parse_buffer *in_RAX;
  parse_buffer *ppVar2;
  
  if ((buffer != (parse_buffer *)0x0) && (buffer->content != (uchar *)0x0)) {
    ppVar1 = (parse_buffer *)buffer->length;
    ppVar2 = (parse_buffer *)buffer->offset;
    if (ppVar2 < ppVar1) {
      do {
        if (0x20 < *(byte *)((long)&ppVar2->content + (long)buffer->content)) goto LAB_0010294f;
        ppVar2 = (parse_buffer *)((long)&ppVar2->content + 1);
        buffer->offset = (size_t)ppVar2;
      } while (ppVar1 != ppVar2);
    }
    else {
LAB_0010294f:
      if (ppVar2 != ppVar1) {
        return ppVar1;
      }
    }
    in_RAX = (parse_buffer *)((long)&ppVar1[-1].hooks.reallocate + 7);
    buffer->offset = (size_t)in_RAX;
  }
  return in_RAX;
}

Assistant:

static parse_buffer *buffer_skip_whitespace(parse_buffer * const buffer)
{
    if ((buffer == NULL) || (buffer->content == NULL))
    {
        return NULL;
    }

    while (can_access_at_index(buffer, 0) && (buffer_at_offset(buffer)[0] <= 32))
    {
       buffer->offset++;
    }

    if (buffer->offset == buffer->length)
    {
        buffer->offset--;
    }

    return buffer;
}